

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::Test::RecordProperty(char *key,int value)

{
  char *value_00;
  String local_40 [2];
  Message local_20;
  Message value_message;
  int value_local;
  char *key_local;
  
  value_message.ss_.ptr_._4_4_ = value;
  Message::Message(&local_20);
  Message::operator<<(&local_20,(int *)((long)&value_message.ss_.ptr_ + 4));
  Message::GetString((Message *)local_40);
  value_00 = internal::String::c_str(local_40);
  RecordProperty(key,value_00);
  internal::String::~String(local_40);
  Message::~Message(&local_20);
  return;
}

Assistant:

void Test::RecordProperty(const char* key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}